

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_close(uv_stream_t *handle)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  
  uv__io_close(handle->loop,&handle->io_watcher);
  uv_read_stop(handle);
  uVar3 = handle->flags;
  if (((uVar3 & 4) != 0) && (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  pbVar2 = (byte *)((long)&handle->flags + 1);
  *pbVar2 = *pbVar2 & 0x3f;
  iVar5 = (handle->io_watcher).fd;
  if (iVar5 != -1) {
    if (2 < iVar5) {
      uv__close(iVar5);
    }
    (handle->io_watcher).fd = -1;
  }
  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }
  pvVar4 = handle->queued_fds;
  if (pvVar4 != (void *)0x0) {
    if (*(int *)((long)pvVar4 + 4) != 0) {
      uVar6 = 0;
      do {
        uv__close(*(int *)((long)pvVar4 + uVar6 * 4 + 8));
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)((long)pvVar4 + 4));
    }
    uv__free(handle->queued_fds);
    handle->queued_fds = (void *)0x0;
  }
  iVar5 = uv__io_active(&handle->io_watcher,5);
  if (iVar5 == 0) {
    return;
  }
  __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x68f,"void uv__stream_close(uv_stream_t *)");
}

Assistant:

void uv__stream_close(uv_stream_t* handle) {
  unsigned int i;
  uv__stream_queued_fds_t* queued_fds;

#if defined(__APPLE__) && !defined(CMAKE_BOOTSTRAP)
  /* Terminate select loop first */
  if (handle->select != NULL) {
    uv__stream_select_t* s;

    s = handle->select;

    uv_sem_post(&s->close_sem);
    uv_sem_post(&s->async_sem);
    uv__stream_osx_interrupt_select(handle);
    uv_thread_join(&s->thread);
    uv_sem_destroy(&s->close_sem);
    uv_sem_destroy(&s->async_sem);
    uv__close(s->fake_fd);
    uv__close(s->int_fd);
    uv_close((uv_handle_t*) &s->async, uv__stream_osx_cb_close);

    handle->select = NULL;
  }
#endif /* defined(__APPLE__) */

  uv__io_close(handle->loop, &handle->io_watcher);
  uv_read_stop(handle);
  uv__handle_stop(handle);
  handle->flags &= ~(UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);

  if (handle->io_watcher.fd != -1) {
    /* Don't close stdio file descriptors.  Nothing good comes from it. */
    if (handle->io_watcher.fd > STDERR_FILENO)
      uv__close(handle->io_watcher.fd);
    handle->io_watcher.fd = -1;
  }

  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }

  /* Close all queued fds */
  if (handle->queued_fds != NULL) {
    queued_fds = handle->queued_fds;
    for (i = 0; i < queued_fds->offset; i++)
      uv__close(queued_fds->fds[i]);
    uv__free(handle->queued_fds);
    handle->queued_fds = NULL;
  }

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
}